

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dispatch.cpp
# Opt level: O1

void __thiscall ac::core::cpu::dispatch::detail::ISA::ISA(ISA *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char **ppcVar4;
  char *__s1;
  
  ruapu_init();
  __s1 = g_ruapu_isa_supported[0];
  if (g_ruapu_isa_supported[0] == (char *)0x0) {
    this->sse = false;
LAB_001b4865:
    bVar1 = false;
LAB_001b4871:
    this->avx = bVar1;
    if (__s1 == (char *)0x0) {
      this->fma = false;
      goto LAB_001b48dc;
    }
    ppcVar4 = g_ruapu_isa_supported;
    pcVar3 = __s1;
    do {
      ppcVar4 = ppcVar4 + 1;
      iVar2 = strcmp(pcVar3,"fma");
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_001b48ad;
      }
      pcVar3 = *ppcVar4;
    } while (pcVar3 != (char *)0x0);
  }
  else {
    ppcVar4 = g_ruapu_isa_supported;
    pcVar3 = g_ruapu_isa_supported[0];
    do {
      ppcVar4 = ppcVar4 + 1;
      iVar2 = strcmp(pcVar3,"sse3");
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_001b4836;
      }
      pcVar3 = *ppcVar4;
    } while (pcVar3 != (char *)0x0);
    bVar1 = false;
LAB_001b4836:
    this->sse = bVar1;
    if (__s1 != (char *)0x0) {
      ppcVar4 = g_ruapu_isa_supported;
      pcVar3 = __s1;
      do {
        ppcVar4 = ppcVar4 + 1;
        iVar2 = strcmp(pcVar3,"avx");
        if (iVar2 == 0) {
          bVar1 = true;
          goto LAB_001b4871;
        }
        pcVar3 = *ppcVar4;
      } while (pcVar3 != (char *)0x0);
      goto LAB_001b4865;
    }
    this->avx = false;
  }
  bVar1 = false;
LAB_001b48ad:
  this->fma = bVar1;
  if (__s1 != (char *)0x0) {
    ppcVar4 = g_ruapu_isa_supported;
    do {
      ppcVar4 = ppcVar4 + 1;
      iVar2 = strcmp(__s1,"neon");
      if (iVar2 == 0) {
        bVar1 = true;
        goto LAB_001b48e2;
      }
      __s1 = *ppcVar4;
    } while (__s1 != (char *)0x0);
  }
LAB_001b48dc:
  bVar1 = false;
LAB_001b48e2:
  this->neon = bVar1;
  return;
}

Assistant:

ISA() noexcept
        {
            ruapu_init();
            sse = ruapu_supports("sse3");
            avx = ruapu_supports("avx");
            fma = ruapu_supports("fma");
            neon = ruapu_supports("neon");
        }